

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_vec_neg32_i64_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i64 d,TCGv_i64 b)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o_1;
  uintptr_t o;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i64_m68k(tcg_ctx,ret,b,-0x100000000);
  tcg_gen_neg_i64(tcg_ctx,ret_00,b);
  tcg_gen_neg_i64(tcg_ctx,ret,ret);
  tcg_gen_deposit_i64_m68k(tcg_ctx,d,ret,ret_00,0,0x20);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_vec_neg32_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 b)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t1, b, ~0xffffffffull);
    tcg_gen_neg_i64(tcg_ctx,t2, b);
    tcg_gen_neg_i64(tcg_ctx,t1, t1);
    tcg_gen_deposit_i64(tcg_ctx, d, t1, t2, 0, 32);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}